

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

Status read_sqsh_header(FILE *fp,SqshHeader *header)

{
  int iVar1;
  Word WVar2;
  size_t sVar3;
  Status SVar4;
  
  sVar3 = fread(header,1,4,(FILE *)fp);
  SVar4 = RERR;
  if (sVar3 == 4) {
    iVar1 = strncmp(header->magic,"SQSH",4);
    if (iVar1 == 0) {
      WVar2 = read_word(fp);
      header->origlen = WVar2;
      WVar2 = read_word(fp);
      header->load = WVar2;
      WVar2 = read_word(fp);
      header->exec = WVar2;
      WVar2 = read_word(fp);
      header->reserved = WVar2;
      SVar4 = NOERR;
    }
    else {
      error("Not a RISC OS squash file");
    }
  }
  return SVar4;
}

Assistant:

Status
read_sqsh_header(FILE *fp, SqshHeader *header)
{
	if (fread(header->magic, 1, 4, fp) != 4)
	{
		return RERR;
	}
	if (strncmp(header->magic, "SQSH", 4) != 0)
	{
		error("Not a RISC OS squash file");
		return RERR;
	}
	header->origlen = read_word(fp);
	header->load = read_word(fp);
	header->exec = read_word(fp);
	header->reserved = read_word(fp);

	return NOERR;
}